

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sp800_56b_check.c
# Opt level: O0

int ossl_rsa_check_private_exponent(RSA *rsa,int nbits,BN_CTX *ctx)

{
  int iVar1;
  BN_CTX *ctx_00;
  BIGNUM *b;
  BIGNUM *b_00;
  BIGNUM *b_01;
  BIGNUM *b_02;
  BIGNUM *b_03;
  BIGNUM *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  BIGNUM *gcd;
  BIGNUM *p1q1;
  BIGNUM *lcm;
  BIGNUM *q1;
  BIGNUM *p1;
  BIGNUM *r;
  int ret;
  bool local_59;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  iVar1 = BN_num_bits(*(BIGNUM **)(in_RDI + 0x38));
  if (in_ESI >> 1 < iVar1) {
    BN_CTX_start((BN_CTX *)in_RDX);
    ctx_00 = (BN_CTX *)BN_CTX_get((BN_CTX *)in_RDX);
    b = BN_CTX_get((BN_CTX *)in_RDX);
    b_00 = BN_CTX_get((BN_CTX *)in_RDX);
    b_01 = BN_CTX_get((BN_CTX *)in_RDX);
    b_02 = BN_CTX_get((BN_CTX *)in_RDX);
    b_03 = BN_CTX_get((BN_CTX *)in_RDX);
    bVar2 = b_03 != (BIGNUM *)0x0;
    if (bVar2) {
      BN_set_flags((BIGNUM *)ctx_00,4);
      BN_set_flags((BIGNUM *)b,4);
      BN_set_flags((BIGNUM *)b_00,4);
      BN_set_flags((BIGNUM *)b_01,4);
      BN_set_flags((BIGNUM *)b_02,4);
      BN_set_flags((BIGNUM *)b_03,4);
    }
    local_59 = false;
    if (bVar2) {
      iVar1 = ossl_rsa_get_lcm(ctx_00,(BIGNUM *)b,(BIGNUM *)b_00,(BIGNUM *)b_01,(BIGNUM *)b_02,
                               (BIGNUM *)b_03,in_RDX,
                               (BIGNUM *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      local_59 = false;
      if (iVar1 == 1) {
        iVar1 = BN_cmp(*(BIGNUM **)(in_RDI + 0x38),b_01);
        local_59 = false;
        if (iVar1 < 0) {
          iVar1 = BN_mod_mul((BIGNUM *)ctx_00,*(BIGNUM **)(in_RDI + 0x30),
                             *(BIGNUM **)(in_RDI + 0x38),b_01,(BN_CTX *)in_RDX);
          local_59 = false;
          if (iVar1 != 0) {
            iVar1 = BN_is_one((BIGNUM *)b_02);
            local_59 = iVar1 != 0;
          }
        }
      }
    }
    local_4 = (uint)local_59;
    BN_clear((BIGNUM *)ctx_00);
    BN_clear(b);
    BN_clear(b_00);
    BN_clear(b_01);
    BN_clear(b_03);
    BN_CTX_end((BN_CTX *)in_RDX);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ossl_rsa_check_private_exponent(const RSA *rsa, int nbits, BN_CTX *ctx)
{
    int ret;
    BIGNUM *r, *p1, *q1, *lcm, *p1q1, *gcd;

    /* (Step 6a) 2^(nbits/2) < d */
    if (BN_num_bits(rsa->d) <= (nbits >> 1))
        return 0;

    BN_CTX_start(ctx);
    r = BN_CTX_get(ctx);
    p1 = BN_CTX_get(ctx);
    q1 = BN_CTX_get(ctx);
    lcm = BN_CTX_get(ctx);
    p1q1 = BN_CTX_get(ctx);
    gcd = BN_CTX_get(ctx);
    if (gcd != NULL) {
        BN_set_flags(r, BN_FLG_CONSTTIME);
        BN_set_flags(p1, BN_FLG_CONSTTIME);
        BN_set_flags(q1, BN_FLG_CONSTTIME);
        BN_set_flags(lcm, BN_FLG_CONSTTIME);
        BN_set_flags(p1q1, BN_FLG_CONSTTIME);
        BN_set_flags(gcd, BN_FLG_CONSTTIME);
        ret = 1;
    } else {
        ret = 0;
    }
    ret = (ret
          /* LCM(p - 1, q - 1) */
          && (ossl_rsa_get_lcm(ctx, rsa->p, rsa->q, lcm, gcd, p1, q1,
                               p1q1) == 1)
          /* (Step 6a) d < LCM(p - 1, q - 1) */
          && (BN_cmp(rsa->d, lcm) < 0)
          /* (Step 6b) 1 = (e . d) mod LCM(p - 1, q - 1) */
          && BN_mod_mul(r, rsa->e, rsa->d, lcm, ctx)
          && BN_is_one(r));

    BN_clear(r);
    BN_clear(p1);
    BN_clear(q1);
    BN_clear(lcm);
    BN_clear(gcd);
    BN_CTX_end(ctx);
    return ret;
}